

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.hpp
# Opt level: O2

void ableton::link::sawPeer(GatewayObserver *observer,PeerState *state)

{
  unsigned_long uVar1;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *this;
  undefined8 uVar2;
  shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl>
  pImpl;
  __shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
  local_c8;
  address local_b8;
  anon_class_120_3_1aa4120e_for_handler_ local_98;
  
  std::
  __shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_c8,
                 (__shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
                  *)observer);
  local_b8.type_ = (observer->mAddr).type_;
  local_b8.ipv4_address_.addr_.s_addr = (observer->mAddr).ipv4_address_.addr_;
  local_b8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  local_b8.ipv6_address_.addr_.__in6_u._8_8_ =
       *(undefined8 *)&(observer->mAddr).ipv6_address_.addr_.__in6_u;
  local_b8.ipv6_address_.scope_id_ =
       *(undefined8 *)((long)&(observer->mAddr).ipv6_address_.addr_.__in6_u + 8);
  if (local_c8._M_ptr != (element_type *)0x0) {
    uVar1 = (observer->mAddr).ipv6_address_.scope_id_;
    this = ((local_c8._M_ptr)->mIo).ref._M_data;
    std::
    __shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
                    *)&local_98,&local_c8);
    local_98.addr.type_ = local_b8.type_;
    local_98.addr.ipv4_address_.addr_.s_addr = local_b8.ipv4_address_.addr_.s_addr;
    local_98.addr.ipv6_address_.addr_.__in6_u._0_8_ = local_b8.ipv6_address_.addr_.__in6_u._8_8_;
    local_98.addr.ipv6_address_.addr_.__in6_u._8_8_ = local_b8.ipv6_address_.scope_id_;
    local_98.state.nodeState.nodeId.super_NodeIdArray._M_elems =
         *(NodeIdArray *)(state->nodeState).nodeId.super_NodeIdArray._M_elems;
    local_98.state.nodeState.sessionId.super_NodeIdArray._M_elems =
         *(NodeIdArray *)(state->nodeState).sessionId.super_NodeIdArray._M_elems;
    local_98.state.nodeState.timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
    super__Head_base<0UL,_double,_false>._M_head_impl =
         (tuple<double>)
         (state->nodeState).timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    local_98.state.nodeState.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
    super__Head_base<0UL,_long,_false>._M_head_impl =
         (tuple<long>)
         (state->nodeState).timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
         super__Head_base<0UL,_long,_false>._M_head_impl;
    local_98.state.nodeState.timeline.timeOrigin.__r = (state->nodeState).timeline.timeOrigin.__r;
    local_98.state.endpoint.impl_.data_._0_8_ = *(undefined8 *)&(state->endpoint).impl_.data_;
    uVar2 = *(undefined8 *)((long)&(state->endpoint).impl_.data_ + 0xc);
    local_98.state.endpoint.impl_.data_._20_8_ =
         *(undefined8 *)((long)&(state->endpoint).impl_.data_ + 0x14);
    local_98.state.endpoint.impl_.data_._8_4_ =
         (undefined4)*(undefined8 *)((long)&(state->endpoint).impl_.data_ + 8);
    local_98.state.endpoint.impl_.data_._12_4_ = (undefined4)uVar2;
    local_98.state.endpoint.impl_.data_._16_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    local_98.addr.ipv6_address_.scope_id_ = uVar1;
    ableton::platforms::asio::
    Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>::
    async<ableton::link::sawPeer(ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,std::reference_wrapper<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionTimelineCallback>::GatewayObserver&,ableton::link::PeerState_const&)::_lambda()_1_>
              ((Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *)this,
               &local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.pImpl.
                super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
    return;
  }
  __assert_fail("pImpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/efairbanks[P]TidaLink/link/include/ableton/link/Peers.hpp"
                ,0x91,"void ableton::link::sawPeer(GatewayObserver &, const PeerState &)");
}

Assistant:

void sawPeer(GatewayObserver& observer, const PeerState& state)
    {
      auto pImpl = observer.mpImpl;
      auto addr = observer.mAddr;
      assert(pImpl);
      pImpl->mIo->async([pImpl, addr, state] {
        pImpl->sawPeerOnGateway(std::move(state), std::move(addr));
      });
    }